

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRandomUniformBlockCase.cpp
# Opt level: O3

void __thiscall
vkt::ubo::RandomUniformBlockCase::generateBlock
          (RandomUniformBlockCase *this,Random *rnd,deUint32 layoutFlags)

{
  deUint32 dVar1;
  deBool dVar2;
  long *plVar3;
  UniformBlock *block;
  size_type *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  uint val;
  string local_78;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Block","");
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78.field_2._8_8_ = plVar3[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  block = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  uVar7 = 0;
  if (0 < this->m_maxInstances) {
    fVar8 = deRandom_getFloat(&rnd->m_rnd);
    if (fVar8 < 0.3) {
      iVar5 = this->m_maxInstances;
      dVar1 = deRandom_getUint32(&rnd->m_rnd);
      uVar7 = dVar1 % (iVar5 + 1U);
    }
  }
  uVar6 = this->m_maxBlockMembers;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  uVar6 = dVar1 % uVar6;
  if ((int)uVar7 < 1) {
    dVar2 = deRandom_getBool(&rnd->m_rnd);
    if (dVar2 != 1) goto LAB_006780ff;
  }
  else {
    block->m_arraySize = uVar7;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"block","");
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78.field_2._8_8_ = plVar3[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&block->m_instanceName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
LAB_006780ff:
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_50 = (long *)((ulong)local_50 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(iterator)0x0,
             (uint *)&local_50);
  if ((this->m_features & 0x4000) != 0) {
    local_50 = (long *)CONCAT44(local_50._4_4_,0x20);
    if (local_78._M_string_length == local_78.field_2._M_allocated_capacity) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                 (iterator)local_78._M_string_length,(uint *)&local_50);
    }
    else {
      *(uint *)local_78._M_string_length = 0x20;
      local_78._M_string_length = local_78._M_string_length + 4;
    }
  }
  local_50 = (long *)((ulong)local_50 & 0xffffffff00000000);
  de::Random::
  choose<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
            (rnd,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_78._M_dataplus._M_p,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_78._M_string_length,(uint *)&local_50,1);
  dVar1 = layoutFlags | (uint)local_50;
  if ((this->m_features & 0x8000) != 0) {
    local_50 = (long *)((ulong)local_50 & 0xffffffff00000000);
    de::Random::choose<unsigned_int_const*,unsigned_int*>
              (rnd,generateBlock::matrixCandidates,generateType::precisionCandidates,
               (uint *)&local_50,1);
    dVar1 = dVar1 | (uint)local_50;
  }
  block->m_flags = dVar1;
  if (uVar6 < 0x7fffffff) {
    iVar5 = 0;
    do {
      generateUniform(this,rnd,block);
      iVar5 = iVar5 + 1;
    } while (iVar5 < (int)(uVar6 + 1));
  }
  this->m_blockNdx = this->m_blockNdx + 1;
  if ((uint *)local_78._M_dataplus._M_p != (uint *)0x0) {
    operator_delete(local_78._M_dataplus._M_p,
                    local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RandomUniformBlockCase::generateBlock (de::Random& rnd, deUint32 layoutFlags)
{
	DE_ASSERT(m_blockNdx <= 'z' - 'a');

	const float		instanceArrayWeight	= 0.3f;
	UniformBlock&	block				= m_interface.allocBlock(std::string("Block") + (char)('A' + m_blockNdx));
	int				numInstances		= (m_maxInstances > 0 && rnd.getFloat() < instanceArrayWeight) ? rnd.getInt(0, m_maxInstances) : 0;
	int				numUniforms			= rnd.getInt(1, m_maxBlockMembers);

	if (numInstances > 0)
		block.setArraySize(numInstances);

	if (numInstances > 0 || rnd.getBool())
		block.setInstanceName(std::string("block") + (char)('A' + m_blockNdx));

	// Layout flag candidates.
	std::vector<deUint32> layoutFlagCandidates;
	layoutFlagCandidates.push_back(0);

	if (m_features & FEATURE_STD140_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_STD140);

	layoutFlags |= rnd.choose<deUint32>(layoutFlagCandidates.begin(), layoutFlagCandidates.end());

	if (m_features & FEATURE_MATRIX_LAYOUT)
	{
		static const deUint32 matrixCandidates[] = { 0, LAYOUT_ROW_MAJOR, LAYOUT_COLUMN_MAJOR };
		layoutFlags |= rnd.choose<deUint32>(&matrixCandidates[0], &matrixCandidates[DE_LENGTH_OF_ARRAY(matrixCandidates)]);
	}

	block.setFlags(layoutFlags);

	for (int ndx = 0; ndx < numUniforms; ndx++)
		generateUniform(rnd, block);

	m_blockNdx += 1;
}